

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_interfaces.c
# Opt level: O0

void nhdp_interface_update_status(nhdp_interface *interf)

{
  list_entity *plVar1;
  bool local_b2;
  _Bool local_b1;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  int local_78;
  uint32_t dualstack;
  uint32_t ipv6_only;
  uint32_t ipv4_only;
  nhdp_link *lnk;
  nhdp_interface *interf_local;
  
  dualstack = 0;
  local_78 = 0;
  __tempptr._4_4_ = 0;
  for (plVar1 = (interf->_links).next; plVar1->prev != (interf->_links).prev; plVar1 = plVar1->next)
  {
    if (*(int *)((long)&plVar1[-0xc].prev + 4) == 1) {
      if (plVar1[-0xb].prev == (list_entity *)0x0) {
        if (*(char *)&plVar1[-10].next[1].next == '\x02') {
          dualstack = dualstack + 1;
        }
        else if (*(char *)&plVar1[-10].next[1].next == '\n') {
          local_78 = local_78 + 1;
        }
      }
      else if (*(char *)&plVar1[-10].next[1].next == '\x02') {
        __tempptr._4_4_ = __tempptr._4_4_ + 1;
      }
    }
  }
  if (((&log_global_mask)[LOG_NHDP] & 1) != 0) {
    oonf_log(1,LOG_NHDP,"src/nhdp/nhdp/nhdp_interfaces.c",0xb3,0,0,
             "Interface %s: ipv4_only=%d ipv6_only=%d dualstack=%d",(interf->_node).key,dualstack,
             local_78,__tempptr._4_4_);
  }
  interf->use_ipv4_for_flooding = dualstack != 0;
  local_b1 = true;
  if (local_78 == 0) {
    local_b2 = dualstack == 0 && __tempptr._4_4_ != 0;
    local_b1 = local_b2;
  }
  interf->use_ipv6_for_flooding = local_b1;
  interf->dualstack_af_type = 0;
  if (__tempptr._4_4_ != 0) {
    if (dualstack == 0) {
      interf->dualstack_af_type = 10;
    }
    else if (local_78 == 0) {
      interf->dualstack_af_type = 2;
    }
  }
  if (((&log_global_mask)[LOG_NHDP] & 1) != 0) {
    oonf_log(1,LOG_NHDP,"src/nhdp/nhdp/nhdp_interfaces.c",0xc6,0,0,
             "Interface %s: floodv4=%d floodv6=%d dualstack=%d",(interf->_node).key,
             interf->use_ipv4_for_flooding & 1,interf->use_ipv6_for_flooding & 1,
             interf->dualstack_af_type);
  }
  return;
}

Assistant:

void
nhdp_interface_update_status(struct nhdp_interface *interf) {
  struct nhdp_link *lnk;
  uint32_t ipv4_only, ipv6_only, dualstack;

  ipv4_only = 0;
  ipv6_only = 0;
  dualstack = 0;

  list_for_each_element(&interf->_links, lnk, _if_node) {
    if (lnk->status != NHDP_LINK_SYMMETRIC) {
      /* link is not symmetric */
      continue;
    }

    if (lnk->dualstack_partner != NULL) {
      if (netaddr_get_address_family(&lnk->neigh->originator) == AF_INET) {
        /* count dualstack only once, not for IPv4 and IPv6 */
        dualstack++;
      }
      continue;
    }

    /* we have a non-dualstack node */
    if (netaddr_get_address_family(&lnk->neigh->originator) == AF_INET) {
      ipv4_only++;
    }
    else if (netaddr_get_address_family(&lnk->neigh->originator) == AF_INET6) {
      ipv6_only++;
    }
  }

  OONF_DEBUG(LOG_NHDP, "Interface %s: ipv4_only=%d ipv6_only=%d dualstack=%d", nhdp_interface_get_name(interf),
    ipv4_only, ipv6_only, dualstack);

  interf->use_ipv4_for_flooding = ipv4_only > 0;
  interf->use_ipv6_for_flooding = ipv6_only > 0 || (ipv4_only == 0 && dualstack > 0);

  interf->dualstack_af_type = AF_UNSPEC;
  if (dualstack > 0) {
    /* we have dualstack capable nodes */
    if (ipv4_only == 0) {
      /* use IPv6 for dualstack, we have no ipv4-only neighbors */
      interf->dualstack_af_type = AF_INET6;
    }
    else if (ipv6_only == 0) {
      /* use IPv4 for dualstack, we have no ipv6-only neighbors */
      interf->dualstack_af_type = AF_INET;
    }
  }

  OONF_DEBUG(LOG_NHDP, "Interface %s: floodv4=%d floodv6=%d dualstack=%d", nhdp_interface_get_name(interf),
    interf->use_ipv4_for_flooding, interf->use_ipv6_for_flooding, interf->dualstack_af_type);
}